

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractspinbox.cpp
# Opt level: O2

void QAbstractSpinBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *specialValueText;
  QFlagsStorage<Qt::AlignmentFlag> *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  byte bVar6;
  QFlagsStorage<Qt::AlignmentFlag> QVar7;
  long lVar8;
  ushort uVar9;
  code *UNRECOVERED_JUMPTABLE;
  ushort uVar10;
  long in_FS_OFFSET;
  undefined8 uStack_40;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        editingFinished((QAbstractSpinBox *)_o);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        returnPressed((QAbstractSpinBox *)_o);
        return;
      }
      break;
    case 2:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1b0);
      lVar8 = *(long *)(in_FS_OFFSET + 0x28);
      if (lVar8 == local_18) {
        uStack_40 = 1;
LAB_00441718:
        (*UNRECOVERED_JUMPTABLE)(_o,uStack_40,lVar8,UNRECOVERED_JUMPTABLE);
        return;
      }
      break;
    case 3:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1b0);
      lVar8 = *(long *)(in_FS_OFFSET + 0x28);
      if (lVar8 == local_18) {
        uStack_40 = 0xffffffffffffffff;
        goto LAB_00441718;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        selectAll((QAbstractSpinBox *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (**(code **)(*(long *)_o + 0x1b8))
                  (_o,&switchD_004415b8::switchdataD_00662210,*(long *)(in_FS_OFFSET + 0x28),
                   *(code **)(*(long *)_o + 0x1b8));
        return;
      }
      break;
    default:
      goto switchD_004415b8_caseD_3;
    }
    goto LAB_00441994;
  case ReadProperty:
    if (0xb < (uint)_id) goto switchD_004415b8_caseD_3;
    pQVar1 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
    switch(_id) {
    case 0:
      bVar6 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 2;
      break;
    case 1:
      bVar6 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 4;
      break;
    case 2:
      QVar7.i = (Int)alignment((QAbstractSpinBox *)_o);
      goto LAB_00441979;
    case 3:
      bVar6 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 1;
      break;
    case 4:
      QVar7.i = *(Int *)(*(long *)(_o + 8) + 0x3c0);
      goto LAB_00441979;
    case 5:
      QAbstractSpinBox::specialValueText((QString *)&local_38,(QAbstractSpinBox *)_o);
      goto LAB_0044192c;
    case 6:
      text((QString *)&local_38,(QAbstractSpinBox *)_o);
LAB_0044192c:
      pDVar3 = *(Data **)pQVar1;
      pcVar4 = *(char16_t **)(pQVar1 + 2);
      *(Data **)pQVar1 = local_38.d;
      *(char16_t **)(pQVar1 + 2) = local_38.ptr;
      qVar2 = *(qsizetype *)(pQVar1 + 4);
      *(qsizetype *)(pQVar1 + 4) = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      goto switchD_004415b8_caseD_3;
    case 7:
      bVar6 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 5;
      break;
    case 8:
      QVar7.i = *(Int *)(*(long *)(_o + 8) + 0x3b8);
LAB_00441979:
      pQVar1->i = QVar7.i;
      goto switchD_004415b8_caseD_3;
    case 9:
      bVar5 = hasAcceptableInput((QAbstractSpinBox *)_o);
      goto LAB_0044196a;
    case 10:
      bVar6 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 6;
      break;
    case 0xb:
      *(byte *)&pQVar1->i = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x3d0) >> 9) & 1;
      goto switchD_004415b8_caseD_3;
    }
    bVar5 = (bool)(bVar6 & 1);
LAB_0044196a:
    *(bool *)&pQVar1->i = bVar5;
    goto switchD_004415b8_caseD_3;
  case WriteProperty:
    if (0xb < (uint)_id) goto switchD_004415b8_caseD_3;
    break;
  default:
    goto switchD_004415b8_caseD_3;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::indexOfMethod<void(QAbstractSpinBox::*)()>
                      ((QtMocHelpers *)_a,(void **)editingFinished,0,0);
    if (!bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QAbstractSpinBox::*)()>
                  ((QtMocHelpers *)_a,(void **)returnPressed,0,1);
        return;
      }
      goto LAB_00441994;
    }
    goto switchD_004415b8_caseD_3;
  }
  specialValueText = (QString *)*_a;
  switch(_id) {
  case 0:
    *(ushort *)(*(long *)(_o + 8) + 0x3d0) =
         ((ushort)*(undefined4 *)(*(long *)(_o + 8) + 0x3d0) & 0xfffb) +
         (ushort)*(byte *)&(specialValueText->d).d * 4;
    goto switchD_004415b8_caseD_3;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setFrame((QAbstractSpinBox *)_o,*(bool *)&(specialValueText->d).d);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setAlignment((QAbstractSpinBox *)_o,
                   (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                   *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&(specialValueText->d).d);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setReadOnly((QAbstractSpinBox *)_o,*(bool *)&(specialValueText->d).d);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setButtonSymbols((QAbstractSpinBox *)_o,*(ButtonSymbols *)&(specialValueText->d).d);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setSpecialValueText((QAbstractSpinBox *)_o,specialValueText);
      return;
    }
    break;
  default:
    goto switchD_004415b8_caseD_3;
  case 7:
    lVar8 = *(long *)(_o + 8);
    uVar9 = (ushort)*(byte *)&(specialValueText->d).d << 5;
    uVar10 = (ushort)*(undefined4 *)(lVar8 + 0x3d0) & 0xffdf;
    goto LAB_00441893;
  case 8:
    *(undefined4 *)(*(long *)(_o + 8) + 0x3b8) = *(undefined4 *)&(specialValueText->d).d;
    goto switchD_004415b8_caseD_3;
  case 10:
    lVar8 = *(long *)(_o + 8);
    uVar9 = (ushort)*(byte *)&(specialValueText->d).d << 6;
    uVar10 = (ushort)*(undefined4 *)(lVar8 + 0x3d0) & 0xffbf;
LAB_00441893:
    *(ushort *)(lVar8 + 0x3d0) = uVar10 | uVar9;
switchD_004415b8_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setGroupSeparatorShown((QAbstractSpinBox *)_o,*(bool *)&(specialValueText->d).d);
      return;
    }
  }
LAB_00441994:
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractSpinBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->returnPressed(); break;
        case 2: _t->stepUp(); break;
        case 3: _t->stepDown(); break;
        case 4: _t->selectAll(); break;
        case 5: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::returnPressed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 2: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 4: *reinterpret_cast<ButtonSymbols*>(_v) = _t->buttonSymbols(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->specialValueText(); break;
        case 6: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isAccelerated(); break;
        case 8: *reinterpret_cast<CorrectionMode*>(_v) = _t->correctionMode(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->keyboardTracking(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->isGroupSeparatorShown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 3: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setButtonSymbols(*reinterpret_cast<ButtonSymbols*>(_v)); break;
        case 5: _t->setSpecialValueText(*reinterpret_cast<QString*>(_v)); break;
        case 7: _t->setAccelerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setCorrectionMode(*reinterpret_cast<CorrectionMode*>(_v)); break;
        case 10: _t->setKeyboardTracking(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setGroupSeparatorShown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}